

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineTestRunnerTest.cpp
# Opt level: O2

void __thiscall
TEST_CommandLineTestRunner_realJunitOutputShouldBeCreatedAndWorkProperly_Test::
~TEST_CommandLineTestRunner_realJunitOutputShouldBeCreatedAndWorkProperly_Test
          (TEST_CommandLineTestRunner_realJunitOutputShouldBeCreatedAndWorkProperly_Test *this)

{
  TEST_GROUP_CppUTestGroupCommandLineTestRunner::~TEST_GROUP_CppUTestGroupCommandLineTestRunner
            (&this->super_TEST_GROUP_CppUTestGroupCommandLineTestRunner);
  operator_delete(this,0x58);
  return;
}

Assistant:

TEST(CommandLineTestRunner, realJunitOutputShouldBeCreatedAndWorkProperly)
{
    const char* argv[] = { "tests.exe", "-ojunit", "-v", "-kpackage", };

    FakeOutput fakeOutput; /* UT_PTR_SET() is not reentrant */

    CommandLineTestRunner commandLineTestRunner(4, argv, &registry);
    commandLineTestRunner.runAllTestsMain();

    fakeOutput.restoreOriginals();

    STRCMP_CONTAINS("<testcase classname=\"package.group1\" name=\"test1\"", fakeOutput.file.asCharString());
    STRCMP_CONTAINS("TEST(group1, test1)", fakeOutput.console.asCharString());

}